

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

int boost::xpressive::detail::
    toi<char_const*,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (char **begin,char *end,
              regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr,int radix,int max)

{
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  bool bVar1;
  int c;
  int i;
  int in_stack_00000198;
  char_type in_stack_0000019f;
  cpp_regex_traits<char> *in_stack_000001a0;
  int local_38;
  int local_34;
  
  local_34 = 0;
  local_38 = 0;
  while( true ) {
    bVar1 = false;
    if (*in_RDI != in_RSI) {
      local_38 = cpp_regex_traits<char>::value
                           (in_stack_000001a0,in_stack_0000019f,in_stack_00000198);
      bVar1 = local_38 != -1;
    }
    if (!bVar1) break;
    local_34 = local_38 + in_ECX * local_34;
    if (in_R8D < local_34) {
      return local_34 / in_ECX;
    }
    *in_RDI = *in_RDI + 1;
  }
  return local_34;
}

Assistant:

int toi(InIter &begin, InIter end, Traits const &tr, int radix = 10, int max = INT_MAX)
{
    detail::ignore_unused(tr);
    int i = 0, c = 0;
    for(; begin != end && -1 != (c = tr.value(*begin, radix)); ++begin)
    {
        if(max < ((i *= radix) += c))
            return i / radix;
    }
    return i;
}